

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_stringsegment.cpp
# Opt level: O3

bool icu_63::numparse::impl::StringSegment::codePointsEqual(UChar32 cp1,UChar32 cp2,bool foldCase)

{
  UChar32 UVar1;
  UChar32 UVar2;
  bool bVar3;
  
  bVar3 = cp1 == cp2;
  if (foldCase && !bVar3) {
    UVar1 = u_foldCase_63(cp1,1);
    UVar2 = u_foldCase_63(cp2,1);
    bVar3 = UVar1 == UVar2;
  }
  return bVar3;
}

Assistant:

bool StringSegment::codePointsEqual(UChar32 cp1, UChar32 cp2, bool foldCase) {
    if (cp1 == cp2) {
        return true;
    }
    if (!foldCase) {
        return false;
    }
    cp1 = u_foldCase(cp1, TRUE);
    cp2 = u_foldCase(cp2, TRUE);
    return cp1 == cp2;
}